

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

size_t xemmai::t_type_of<xemmai::t_list>::f_do_set_at(t_object *a_this,t_pvalue *a_stack)

{
  anon_class_16_2_47b0d7ab a_do;
  t_object *a_object;
  t_list *this;
  t_list *list;
  t_pvalue *a_stack_local;
  t_object *a_this_local;
  
  list = (t_list *)a_stack;
  a_stack_local = (t_pvalue *)a_this;
  a_object = t_pointer::operator_cast_to_t_object_(&a_stack[2].super_t_pointer);
  f_check<long>(a_object,L"index");
  this = t_object::f_as<xemmai::t_list>((t_object *)a_stack_local);
  a_do.list = this;
  a_do.a_stack = (t_pvalue **)&list;
  t_sharable::
  f_owned_or_shared<std::lock_guard,xemmai::t_type_of<xemmai::t_list>::f_do_set_at(xemmai::t_object*,xemmai::t_value<xemmai::t_pointer>*)::__0>
            (&this->super_t_sharable,a_do);
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_list>::f_do_set_at(t_object* a_this, t_pvalue* a_stack)
{
	f_check<intptr_t>(a_stack[2], L"index");
	auto& list = a_this->f_as<t_list>();
	list.f_owned_or_shared<std::lock_guard>([&]
	{
		a_stack[0] = list[f_as<intptr_t>(a_stack[2])] = a_stack[3];
	});
	return -1;
}